

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

float ImGui::TabBarScrollClamp(ImGuiTabBar *tab_bar,float scrolling)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar3 [64];
  
  auVar3._4_60_ = in_register_00001204;
  auVar3._0_4_ = scrolling;
  auVar2 = vminss_avx(auVar3._0_16_,
                      ZEXT416((uint)(tab_bar->WidthAllTabs -
                                    ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x))));
  auVar1 = vcmpss_avx(ZEXT816(0),auVar2,2);
  auVar1 = vandps_avx(auVar1,auVar2);
  return auVar1._0_4_;
}

Assistant:

float       GetWidth() const                    { return Max.x - Min.x; }